

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_WriteArray(BCWriterState *s,JSValue obj)

{
  int iVar1;
  JSContext *pJVar2;
  bool bVar3;
  uint8_t c;
  int iVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  JSValueUnion JVar7;
  JSRefCountHeader *p;
  JSRefCountHeader *p_1;
  void *pvVar8;
  bool bVar9;
  JSValue JVar10;
  uint32_t len;
  uint local_3c;
  void *local_38;
  
  if ((s->field_0x39 == '\0') || ((*(byte *)((long)obj.u.ptr + 5) & 1) != 0)) {
    bVar3 = true;
    c = '\t';
  }
  else {
    c = '\r';
    bVar3 = false;
  }
  dbuf_putc(&s->dbuf,c);
  iVar4 = js_get_length32(s->ctx,&local_3c,obj);
  if (iVar4 == 0) {
    pvVar8 = (void *)(ulong)local_3c;
    dbuf_put_leb128(&s->dbuf,local_3c);
    local_38 = pvVar8;
    if (pvVar8 != (void *)0x0) {
      JVar7.float64 = 0.0;
      do {
        bVar9 = -1 < JVar7.int32;
        JVar5.float64 = (double)((ulong)JVar7.ptr & 0xffffffff);
        if (bVar9) {
          JVar5 = JVar7;
        }
        iVar6 = 7;
        if (bVar9) {
          iVar6 = 0;
        }
        JVar10.tag = iVar6;
        JVar10.u.float64 = JVar5.float64;
        JVar10 = JS_GetPropertyValue(s->ctx,obj,JVar10);
        if ((uint)JVar10.tag == 6) {
          return -1;
        }
        iVar4 = JS_WriteObjectRec(s,JVar10);
        if (0xfffffff4 < (uint)JVar10.tag) {
          pJVar2 = s->ctx;
          iVar1 = *JVar10.u.ptr;
          *(int *)JVar10.u.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            __JS_FreeValueRT(pJVar2->rt,JVar10);
          }
        }
        if (iVar4 != 0) {
          return -1;
        }
        JVar7.float64 = JVar7.float64 + 1;
      } while (local_38 != JVar7.ptr);
    }
    if (bVar3) {
      return 0;
    }
    JVar10 = JS_GetPropertyInternal(s->ctx,obj,0x70,obj,0);
    if ((uint)JVar10.tag != 6) {
      iVar4 = JS_WriteObjectRec(s,JVar10);
      if (0xfffffff4 < (uint)JVar10.tag) {
        pJVar2 = s->ctx;
        iVar1 = *JVar10.u.ptr;
        *(int *)JVar10.u.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(pJVar2->rt,JVar10);
        }
      }
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int JS_WriteArray(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, len;
    JSValue val;
    int ret;
    BOOL is_template;
    
    if (s->allow_bytecode && !p->extensible) {
        /* not extensible array: we consider it is a
           template when we are saving bytecode */
        bc_put_u8(s, BC_TAG_TEMPLATE_OBJECT);
        is_template = TRUE;
    } else {
        bc_put_u8(s, BC_TAG_ARRAY);
        is_template = FALSE;
    }
    if (js_get_length32(s->ctx, &len, obj))
        goto fail1;
    bc_put_leb128(s, len);
    for(i = 0; i < len; i++) {
        val = JS_GetPropertyUint32(s->ctx, obj, i);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    if (is_template) {
        val = JS_GetProperty(s->ctx, obj, JS_ATOM_raw);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    return 0;
 fail1:
    return -1;
}